

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall
SQFuncState::SetInstructionParam(SQFuncState *this,SQInteger pos,SQInteger arg,SQInteger val)

{
  uchar uVar1;
  SQInstruction *pSVar2;
  SQInt32 in_ECX;
  undefined8 in_RDX;
  SQUnsignedInteger in_RSI;
  long in_RDI;
  
  uVar1 = (uchar)in_ECX;
  switch(in_RDX) {
  case 0:
    pSVar2 = sqvector<SQInstruction>::operator[]((sqvector<SQInstruction> *)(in_RDI + 0xc0),in_RSI);
    pSVar2->_arg0 = uVar1;
    break;
  case 1:
  case 4:
    pSVar2 = sqvector<SQInstruction>::operator[]((sqvector<SQInstruction> *)(in_RDI + 0xc0),in_RSI);
    pSVar2->_arg1 = in_ECX;
    break;
  case 2:
    pSVar2 = sqvector<SQInstruction>::operator[]((sqvector<SQInstruction> *)(in_RDI + 0xc0),in_RSI);
    pSVar2->_arg2 = uVar1;
    break;
  case 3:
    pSVar2 = sqvector<SQInstruction>::operator[]((sqvector<SQInstruction> *)(in_RDI + 0xc0),in_RSI);
    pSVar2->_arg3 = uVar1;
  }
  return;
}

Assistant:

void SQFuncState::SetInstructionParam(SQInteger pos,SQInteger arg,SQInteger val)
{
    switch(arg){
        case 0:_instructions[pos]._arg0=(unsigned char)*((SQUnsignedInteger *)&val);break;
        case 1:case 4:_instructions[pos]._arg1=(SQInt32)*((SQUnsignedInteger *)&val);break;
        case 2:_instructions[pos]._arg2=(unsigned char)*((SQUnsignedInteger *)&val);break;
        case 3:_instructions[pos]._arg3=(unsigned char)*((SQUnsignedInteger *)&val);break;
    };
}